

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::cord_internal::CordzHandle::DiagnosticsHandleIsSafeToInspect
          (CordzHandle *this,CordzHandle *handle)

{
  CordzHandle *pCVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  byte bVar3;
  bool bVar4;
  
  if (this->is_snapshot_ == true) {
    if (handle == (CordzHandle *)0x0) {
      bVar3 = 1;
      goto LAB_003818b2;
    }
    if (handle->is_snapshot_ == false) {
      anon_unknown_0::GlobalQueue();
      Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
      bVar4 = anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ == 0;
      if (bVar4) {
        bVar2 = false;
      }
      else {
        bVar2 = false;
        pCVar1 = (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
        do {
          if (pCVar1 == handle) {
            handle = (CordzHandle *)(ulong)(bVar2 ^ 1);
            break;
          }
          if (pCVar1 == this) {
            bVar2 = true;
          }
          pCVar1 = pCVar1->dq_prev_;
          bVar4 = pCVar1 == (CordzHandle *)0x0;
        } while (!bVar4);
      }
      bVar3 = (byte)handle;
      if ((bVar4) && (bVar3 = 1, !bVar2)) {
        DiagnosticsHandleIsSafeToInspect();
        __clang_call_terminate(extraout_RAX);
      }
      Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
      goto LAB_003818b2;
    }
  }
  bVar3 = 0;
LAB_003818b2:
  return (bool)(bVar3 & 1);
}

Assistant:

bool CordzHandle::DiagnosticsHandleIsSafeToInspect(
    const CordzHandle* handle) const {
  if (!is_snapshot_) return false;
  if (handle == nullptr) return true;
  if (handle->is_snapshot_) return false;
  bool snapshot_found = false;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  for (const CordzHandle* p = global_queue.dq_tail; p; p = p->dq_prev_) {
    if (p == handle) return !snapshot_found;
    if (p == this) snapshot_found = true;
  }
  ABSL_ASSERT(snapshot_found);  // Assert that 'this' is in delete queue.
  return true;
}